

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

void __thiscall
tinyusdz::GeomPrimvar::set_indices
          (GeomPrimvar *this,vector<int,_std::allocator<int>_> *indices,double t)

{
  bool bVar1;
  Sample *psample;
  Sample *local_18;
  
  if (!NAN(t)) {
    local_18 = (Sample *)0x0;
    bVar1 = TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_sample_at
                      (&this->_ts_indices,t,&local_18);
    if (bVar1) {
      ::std::vector<int,_std::allocator<int>_>::operator=(&local_18->value,indices);
    }
    else {
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::add_sample
                (&this->_ts_indices,t,indices);
    }
    return;
  }
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->_indices,indices);
  return;
}

Assistant:

void GeomPrimvar::set_indices(const std::vector<int32_t> &indices, const double t) {
  if (value::TimeCode(t).is_default()) {
    _indices = indices;
  } else {
    TypedTimeSamples<std::vector<int32_t>>::Sample *psample{nullptr};
    if (_ts_indices.get_sample_at(t, &psample)) {
      // overwrite content
      psample->value = indices;
    } else {
      _ts_indices.add_sample(t, indices);
    }
  }
}